

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_cmdline.cpp
# Opt level: O2

bool __thiscall Omega_h::CmdLine::parse_final(CmdLine *this,CommPtr *comm,int *p_argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  I32 IVar3;
  __shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  IVar3 = Comm::rank((comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  bVar1 = parse(this,p_argc,argv,IVar3 == 0);
  std::__shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,&comm->super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>);
  bVar2 = check_empty((CommPtr *)&local_40,*p_argc,argv);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  if (((!bVar1) || (!bVar2)) || (bVar1 = true, this->parsed_help_ != false)) {
    show_help(this,argv);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool CmdLine::parse_final(CommPtr comm, int* p_argc, char** argv) {
  bool no_error = parse(p_argc, argv, !comm->rank());
  bool was_empty = check_empty(comm, *p_argc, argv);
  if (no_error && !parsed_help_ && was_empty) return true;
  show_help(argv);
  return false;
}